

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-prepare.c
# Opt level: O3

int run_test_pipe_connect_on_prepare(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  int iVar3;
  uv_prepare_t *puVar4;
  long *plVar5;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_30;
  code *pcStack_28;
  uv_prepare_t *puStack_20;
  void *local_18;
  void *local_10;
  
  iVar3 = (int)&local_18;
  puStack_20 = (uv_prepare_t *)0x1b18ce;
  uVar2 = uv_default_loop();
  puStack_20 = (uv_prepare_t *)0x1b18df;
  iVar1 = uv_pipe_init(uVar2,&pipe_handle,0);
  local_10 = (void *)(long)iVar1;
  local_18 = (void *)0x0;
  if (local_10 == (void *)0x0) {
    puStack_20 = (uv_prepare_t *)0x1b1902;
    uVar2 = uv_default_loop();
    puStack_20 = (uv_prepare_t *)0x1b1911;
    iVar1 = uv_prepare_init(uVar2,&prepare_handle);
    local_10 = (void *)(long)iVar1;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001b1a37;
    puStack_20 = (uv_prepare_t *)0x1b1942;
    iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
    local_10 = (void *)(long)iVar1;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001b1a44;
    puStack_20 = (uv_prepare_t *)0x1b1965;
    uVar2 = uv_default_loop();
    puStack_20 = (uv_prepare_t *)0x1b196f;
    iVar1 = uv_run(uVar2,0);
    local_10 = (void *)(long)iVar1;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001b1a51;
    local_10 = (void *)0x2;
    local_18 = (void *)(long)close_cb_called;
    if (local_18 != (void *)0x2) goto LAB_001b1a5e;
    local_10 = (void *)0x1;
    local_18 = (void *)(long)connect_cb_called;
    if (local_18 == (void *)0x1) {
      puStack_20 = (uv_prepare_t *)0x1b19d8;
      unaff_RBX = uv_default_loop();
      puStack_20 = (uv_prepare_t *)0x1b19ec;
      uv_walk(unaff_RBX,close_walk_cb,0);
      puStack_20 = (uv_prepare_t *)0x1b19f6;
      uv_run(unaff_RBX,0);
      local_10 = (void *)0x0;
      puStack_20 = (uv_prepare_t *)0x1b1a04;
      uVar2 = uv_default_loop();
      puStack_20 = (uv_prepare_t *)0x1b1a0c;
      iVar1 = uv_loop_close(uVar2);
      local_18 = (void *)(long)iVar1;
      if (local_10 == local_18) {
        puStack_20 = (uv_prepare_t *)0x1b1a22;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b1a78;
    }
  }
  else {
    puStack_20 = (uv_prepare_t *)0x1b1a37;
    run_test_pipe_connect_on_prepare_cold_1();
LAB_001b1a37:
    puStack_20 = (uv_prepare_t *)0x1b1a44;
    run_test_pipe_connect_on_prepare_cold_2();
LAB_001b1a44:
    puStack_20 = (uv_prepare_t *)0x1b1a51;
    run_test_pipe_connect_on_prepare_cold_3();
LAB_001b1a51:
    puStack_20 = (uv_prepare_t *)0x1b1a5e;
    run_test_pipe_connect_on_prepare_cold_4();
LAB_001b1a5e:
    puStack_20 = (uv_prepare_t *)0x1b1a6b;
    run_test_pipe_connect_on_prepare_cold_5();
  }
  puStack_20 = (uv_prepare_t *)0x1b1a78;
  run_test_pipe_connect_on_prepare_cold_6();
LAB_001b1a78:
  puVar4 = (uv_prepare_t *)&stack0xfffffffffffffff0;
  puStack_20 = (uv_prepare_t *)prepare_cb;
  run_test_pipe_connect_on_prepare_cold_7();
  if (puVar4 == &prepare_handle) {
    iVar1 = uv_pipe_connect(&conn_req,&pipe_handle,
                            "/path/to/unix/socket/that/really/should/not/be/there",connect_cb);
    return iVar1;
  }
  puStack_20 = &prepare_handle;
  pcStack_28 = connect_cb;
  prepare_cb_cold_1();
  lStack_30 = (long)iVar3;
  pcStack_28 = (code *)unaff_RBX;
  if (lStack_30 == -2) {
    connect_cb_called = connect_cb_called + 1;
    uv_close(&prepare_handle,close_cb);
    iVar1 = uv_close(&pipe_handle,close_cb);
    return iVar1;
  }
  plVar5 = &lStack_30;
  connect_cb_cold_1();
  if (plVar5 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar5,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_connect_on_prepare) {
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe_handle, 0);
  ASSERT_OK(r);

  r = uv_prepare_init(uv_default_loop(), &prepare_handle);
  ASSERT_OK(r);
  r = uv_prepare_start(&prepare_handle, prepare_cb);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(1, connect_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}